

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_value.h
# Opt level: O0

void __thiscall docopt::value::throwIfNotKind(value *this,Kind expected)

{
  char *pcVar1;
  runtime_error *this_00;
  allocator local_39;
  string local_38 [8];
  string error;
  Kind expected_local;
  value *this_local;
  
  if (this->kind == expected) {
    return;
  }
  error.field_2._12_4_ = expected;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"Illegal cast to ",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  pcVar1 = kindAsString(error.field_2._12_4_);
  std::__cxx11::string::operator+=(local_38,pcVar1);
  std::__cxx11::string::operator+=(local_38,"; type is actually ");
  pcVar1 = kindAsString(this->kind);
  std::__cxx11::string::operator+=(local_38,pcVar1);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,local_38);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void throwIfNotKind(Kind expected) const {
			if (kind == expected)
				return;

			std::string error = "Illegal cast to ";
			error += kindAsString(expected);
			error += "; type is actually ";
			error += kindAsString(kind);
			throw std::runtime_error(std::move(error));
		}